

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  BYTE *s;
  ushort *puVar10;
  ushort *__src;
  ushort *puVar11;
  long lVar12;
  byte *pbVar13;
  BYTE *pBVar14;
  uint uVar15;
  BYTE *pBVar16;
  ulong uVar17;
  BYTE *d_1;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  long lVar22;
  BYTE *d;
  ushort *puVar23;
  ushort *puVar24;
  ulong uVar25;
  ulong uVar26;
  int local_68;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar22 = (long)dictStart + dictSize;
  if (dictStart == (void *)0x0) {
    lVar22 = 0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar1 = (ushort *)(source + compressedSize);
  pBVar2 = (BYTE *)(dest + maxOutputSize);
  pBVar19 = (BYTE *)dest;
  __src = (ushort *)source;
  if (maxOutputSize < 0x40) goto LAB_0010aa79;
  puVar23 = (ushort *)source;
LAB_0010a490:
  __src = (ushort *)((long)puVar23 + 1);
  bVar4 = (byte)*puVar23;
  uVar9 = (uint)bVar4;
  uVar17 = (ulong)(uint)(bVar4 >> 4);
  if (bVar4 >> 4 == 0xf) {
    if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010aada;
    puVar24 = puVar23 + 1;
    uVar15 = 0;
    puVar23 = puVar23 + 8;
    do {
      puVar11 = puVar23;
      puVar10 = __src;
      __src = (ushort *)((long)puVar10 + 1);
      uVar15 = uVar15 + *(byte *)((long)puVar11 + -0xf);
      puVar24 = (ushort *)((long)puVar24 + 1);
      puVar23 = (ushort *)((long)puVar11 + 1);
    } while (puVar11 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
             *(byte *)((long)puVar11 + -0xf) == 0xff);
    uVar17 = (ulong)uVar15 + 0xf;
    pBVar18 = pBVar19 + uVar17;
    if ((CARRY8((ulong)pBVar19,uVar17)) || ((ulong)-(long)puVar24 < uVar17)) {
      __src = puVar11 + -7;
      goto LAB_0010aada;
    }
    if (dest + (long)maxOutputSize + -0x20 < pBVar18) goto LAB_0010a8c0;
    puVar23 = (ushort *)((ulong)uVar15 + (long)puVar11 + 1);
    if (puVar1 + -0x10 < puVar23) {
      __src = puVar11 + -7;
      goto LAB_0010a8c0;
    }
    lVar12 = 0;
    do {
      uVar7 = *(undefined8 *)((byte *)((long)__src + lVar12) + 8);
      pBVar20 = pBVar19 + lVar12;
      *(undefined8 *)pBVar20 = *(undefined8 *)((long)__src + lVar12);
      *(undefined8 *)(pBVar20 + 8) = uVar7;
      pbVar13 = (byte *)((long)puVar10 + lVar12 + 0x11);
      uVar7 = *(undefined8 *)(pbVar13 + 8);
      *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pbVar13;
      *(undefined8 *)(pBVar20 + 0x18) = uVar7;
      lVar12 = lVar12 + 0x20;
    } while (pBVar20 + 0x20 < pBVar18);
  }
  else {
    pBVar18 = pBVar19 + uVar17;
    if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010a8c0;
    uVar7 = *(undefined8 *)((long)puVar23 + 9);
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pBVar19 + 8) = uVar7;
    puVar23 = (ushort *)(uVar17 + (long)__src);
  }
  uVar6 = *puVar23;
  uVar25 = (ulong)uVar6;
  __src = puVar23 + 1;
  pBVar20 = pBVar18 + -uVar25;
  uVar17 = (ulong)(bVar4 & 0xf);
  if (uVar17 == 0xf) {
    if ((dictSize < 0x10000) && (pBVar20 + dictSize < dest)) goto LAB_0010aada;
    uVar9 = 0;
    puVar23 = __src;
    do {
      __src = (ushort *)((long)puVar23 + 1);
      if (puVar1 + -2 <= __src) goto LAB_0010aada;
      uVar8 = *puVar23;
      uVar9 = uVar9 + (byte)uVar8;
      puVar23 = __src;
    } while ((byte)uVar8 == 0xff);
    uVar17 = (ulong)uVar9;
    if ((BYTE *)(-uVar17 - 0x10) < pBVar18) goto LAB_0010aada;
    uVar26 = uVar17 + 0x13;
    if (pBVar2 + -0x40 <= pBVar18 + uVar17 + 0x13) goto LAB_0010a94c;
  }
  else {
    uVar26 = uVar17 + 4;
    if (pBVar2 + -0x40 <= pBVar18 + uVar17 + 4) goto LAB_0010a94c;
    if ((dest <= pBVar20) && (7 < uVar6)) {
      *(undefined8 *)pBVar18 = *(undefined8 *)pBVar20;
      *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar20 + 8);
      *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar20 + 0x10);
      pBVar19 = pBVar18 + uVar17 + 4;
      puVar23 = __src;
      goto LAB_0010a490;
    }
  }
  if ((dictSize < 0x10000) && (pBVar20 + dictSize < dest)) goto LAB_0010aada;
  pBVar3 = pBVar18 + uVar26;
  pBVar19 = pBVar3;
  puVar23 = __src;
  if (pBVar20 < dest) {
    if (pBVar2 + -5 < pBVar3) goto LAB_0010aada;
    uVar17 = (long)dest - (long)pBVar20;
    uVar25 = uVar26 - uVar17;
    if (uVar26 < uVar17 || uVar25 == 0) {
      memmove(pBVar18,(void *)(lVar22 - uVar17),uVar26);
    }
    else {
      memcpy(pBVar18,(void *)(lVar22 - uVar17),uVar17);
      pBVar19 = pBVar18 + uVar17;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar25) {
        pBVar18 = (BYTE *)dest;
        if (uVar17 < uVar26) {
          do {
            *pBVar19 = *pBVar18;
            pBVar19 = pBVar19 + 1;
            pBVar18 = pBVar18 + 1;
          } while (pBVar19 < pBVar3);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar25);
        pBVar19 = pBVar3;
      }
    }
  }
  else if (uVar6 < 0x10) {
    LZ4_memcpy_using_offset(pBVar18,pBVar20,pBVar3,uVar25);
  }
  else {
    do {
      uVar7 = *(undefined8 *)(pBVar18 + -uVar25 + 8);
      *(undefined8 *)pBVar18 = *(undefined8 *)(pBVar18 + -uVar25);
      *(undefined8 *)(pBVar18 + 8) = uVar7;
      uVar7 = *(undefined8 *)(pBVar18 + -uVar25 + 0x10 + 8);
      *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(pBVar18 + -uVar25 + 0x10);
      *(undefined8 *)(pBVar18 + 0x18) = uVar7;
      pBVar18 = pBVar18 + 0x20;
    } while (pBVar18 < pBVar3);
  }
  goto LAB_0010a490;
LAB_0010a94c:
  if ((dictSize < 0x10000) && (pBVar20 + dictSize < dest)) goto LAB_0010aada;
  pBVar3 = pBVar18 + uVar26;
  pBVar19 = pBVar3;
  if (pBVar20 < dest) {
    if (pBVar2 + -5 < pBVar3) goto LAB_0010aada;
    uVar17 = (long)dest - (long)pBVar20;
    uVar25 = uVar26 - uVar17;
    if (uVar26 < uVar17 || uVar25 == 0) {
      memmove(pBVar18,(void *)(lVar22 - uVar17),uVar26);
    }
    else {
      memcpy(pBVar18,(void *)(lVar22 - uVar17),uVar17);
      pBVar19 = pBVar18 + uVar17;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar25) {
        pBVar18 = (BYTE *)dest;
        if (uVar17 < uVar26) {
          do {
            *pBVar19 = *pBVar18;
            pBVar19 = pBVar19 + 1;
            pBVar18 = pBVar18 + 1;
          } while (pBVar19 < pBVar3);
        }
      }
      else {
        memcpy(pBVar19,dest,uVar25);
        pBVar19 = pBVar3;
      }
    }
  }
  else {
    if ((uint)uVar25 < 8) {
      pBVar18[0] = '\0';
      pBVar18[1] = '\0';
      pBVar18[2] = '\0';
      pBVar18[3] = '\0';
      *pBVar18 = *pBVar20;
      pBVar18[1] = pBVar20[1];
      pBVar18[2] = pBVar20[2];
      pBVar18[3] = pBVar20[3];
      uVar17 = (ulong)((uint)uVar25 << 2);
      uVar25 = (ulong)*(uint *)((long)inc32table + uVar17);
      *(undefined4 *)(pBVar18 + 4) = *(undefined4 *)(pBVar20 + uVar25);
      pBVar20 = pBVar20 + (uVar25 - (long)*(int *)((long)dec64table + uVar17));
    }
    else {
      *(undefined8 *)pBVar18 = *(undefined8 *)pBVar20;
      pBVar20 = pBVar20 + 8;
    }
    pBVar14 = pBVar18 + 8;
    if (pBVar2 + -0xc < pBVar3) {
      if (pBVar2 + -5 < pBVar3) goto LAB_0010aada;
      pBVar18 = pBVar2 + -7;
      pBVar16 = pBVar20;
      pBVar21 = pBVar14;
      if (pBVar14 < pBVar18) {
        do {
          *(undefined8 *)pBVar21 = *(undefined8 *)pBVar16;
          pBVar21 = pBVar21 + 8;
          pBVar16 = pBVar16 + 8;
        } while (pBVar21 < pBVar18);
        pBVar20 = pBVar20 + ((long)pBVar18 - (long)pBVar14);
        pBVar14 = pBVar18;
      }
      for (; pBVar14 < pBVar3; pBVar14 = pBVar14 + 1) {
        BVar5 = *pBVar20;
        pBVar20 = pBVar20 + 1;
        *pBVar14 = BVar5;
      }
    }
    else {
      *(undefined8 *)pBVar14 = *(undefined8 *)pBVar20;
      if (0x10 < uVar26) {
        pBVar18 = pBVar18 + 0x10;
        do {
          pBVar20 = pBVar20 + 8;
          *(undefined8 *)pBVar18 = *(undefined8 *)pBVar20;
          pBVar18 = pBVar18 + 8;
        } while (pBVar18 < pBVar3);
      }
    }
  }
LAB_0010aa79:
  bVar4 = (byte)*__src;
  __src = (ushort *)((long)__src + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar17 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar19)) goto LAB_0010a8bc;
    uVar7 = *(undefined8 *)(__src + 4);
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pBVar19 + 8) = uVar7;
    pBVar18 = pBVar19 + uVar17;
    uVar26 = (ulong)(uVar9 & 0xf);
    puVar23 = (ushort *)((long)__src + uVar17);
    uVar25 = (ulong)*puVar23;
    pBVar20 = pBVar18 + -uVar25;
    if ((((uVar9 & 0xf) == 0xf) || (*puVar23 < 8)) || (pBVar20 < dest)) goto LAB_0010a905;
    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar20;
    *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar20 + 8);
    *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar20 + 0x10);
    pBVar19 = pBVar18 + uVar26 + 4;
    bVar4 = *(byte *)((long)__src + uVar17 + 2);
    __src = (ushort *)((long)__src + uVar17 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010aada;
  pbVar13 = (byte *)((long)__src + 1);
  uVar15 = 0;
  do {
    uVar6 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar15 = uVar15 + (byte)uVar6;
    pbVar13 = pbVar13 + 1;
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar17 = (ulong)uVar15 + 0xf;
  if ((CARRY8((ulong)pBVar19,uVar17)) || ((ulong)-(long)pbVar13 < uVar17)) goto LAB_0010aada;
LAB_0010a8bc:
  pBVar18 = pBVar19 + uVar17;
LAB_0010a8c0:
  puVar23 = (ushort *)((long)__src + uVar17);
  if ((pBVar2 + -0xc < pBVar18) || (puVar1 + -4 < puVar23)) {
    if ((puVar23 == puVar1) && (pBVar18 <= pBVar2)) {
      memmove(pBVar19,__src,uVar17);
      return ((int)pBVar19 + (int)uVar17) - (int)dest;
    }
    goto LAB_0010aada;
  }
  do {
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    pBVar19 = pBVar19 + 8;
    __src = __src + 4;
  } while (pBVar19 < pBVar18);
  uVar25 = (ulong)*puVar23;
  pBVar20 = pBVar18 + -uVar25;
  uVar26 = (ulong)(uVar9 & 0xf);
LAB_0010a905:
  __src = puVar23 + 1;
  if ((int)uVar26 == 0xf) {
    uVar9 = 0;
    do {
      puVar23 = __src;
      __src = (ushort *)((long)puVar23 + 1);
      if (puVar1 + -2 <= __src) goto LAB_0010aad7;
      uVar9 = uVar9 + (byte)*puVar23;
    } while ((byte)*puVar23 == 0xff);
    uVar26 = (ulong)uVar9 + 0xf;
    if (CARRY8((ulong)pBVar18,uVar26)) {
LAB_0010aad7:
      __src = (ushort *)((long)puVar23 + 1);
LAB_0010aada:
      local_68 = (int)source;
      return ~(uint)__src + local_68;
    }
  }
  uVar26 = uVar26 + 4;
  goto LAB_0010a94c;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}